

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

int lddmc_member_cube(MDD a,uint32_t *values,size_t count)

{
  size_t local_28;
  size_t count_local;
  uint32_t *values_local;
  MDD a_local;
  
  local_28 = count;
  count_local = (size_t)values;
  values_local = (uint32_t *)a;
  while( true ) {
    if (values_local == (uint32_t *)0x0) {
      return 0;
    }
    if (values_local == (uint32_t *)0x1) break;
    if (local_28 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x73b,"int lddmc_member_cube(MDD, uint32_t *, size_t)");
    }
    values_local = (uint32_t *)lddmc_follow((MDD)values_local,*(uint32_t *)count_local);
    count_local = count_local + 4;
    local_28 = local_28 - 1;
  }
  return 1;
}

Assistant:

int
lddmc_member_cube(MDD a, uint32_t* values, size_t count)
{
    while (1) {
        if (a == lddmc_false) return 0;
        if (a == lddmc_true) return 1;
        if (count <= 0) assert(count > 0); // size mismatch

        a = lddmc_follow(a, *values);
        values++;
        count--;
    }
}